

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify_cfg.cpp
# Opt level: O2

bool __thiscall mocker::RewriteBranches::operator()(RewriteBranches *this)

{
  BasicBlock *bb;
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  shared_ptr<mocker::ir::Branch> br;
  shared_ptr<mocker::ir::Label> notTarget;
  shared_ptr<mocker::ir::IntLiteral> condition;
  shared_ptr<mocker::ir::Label> target;
  long local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2> local_70;
  shared_ptr<mocker::ir::Addr> local_60;
  _List_node_base *local_50;
  _List_node_base *local_48;
  __shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  p_Var2 = (_List_node_base *)&((this->super_FuncPass).func)->bbs;
  local_50 = p_Var2;
  while (p_Var2 = (((_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)
                   &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != local_50) {
    p_Var1 = (_List_node_base *)&p_Var2[1]._M_prev;
    p_Var3 = p_Var1;
    local_48 = p_Var1;
    while (p_Var1 = p_Var1->_M_next, p_Var1 != p_Var3) {
      ir::dyc<mocker::ir::Branch,std::shared_ptr<mocker::ir::IRInst>&>
                ((ir *)&local_80,(shared_ptr<mocker::ir::IRInst> *)(p_Var1 + 1));
      if (local_80 != 0) {
        std::dynamic_pointer_cast<mocker::ir::IntLiteral,mocker::ir::Addr>(&local_60);
        if (local_60.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          this->cnt = this->cnt + 1;
          std::__shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_40,
                     (__shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2> *)
                     (local_80 +
                      (ulong)(local_60.
                              super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr[1]._vptr_Addr == (_func_int **)0x0) * 0x10 + 0x28));
          std::make_shared<mocker::ir::Jump,std::shared_ptr<mocker::ir::Label>&>
                    ((shared_ptr<mocker::ir::Label> *)&local_70);
          std::__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2> *)(p_Var1 + 1),
                     &local_70);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
          std::__shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2> *)&local_70,
                     (__shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2> *)
                     (local_80 +
                      (ulong)(local_60.
                              super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr[1]._vptr_Addr != (_func_int **)0x0) * 0x10 + 0x28));
          bb = ir::FunctionModule::getMutableBasicBlock
                         ((this->super_FuncPass).func,
                          *(size_t *)&((local_70._M_ptr)->super_IRInst).type);
          deletePhiOptionInBB(bb,(size_t)p_Var2[1]._M_next);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
          p_Var3 = local_48;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_60.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
    }
  }
  return this->cnt != 0;
}

Assistant:

bool RewriteBranches::operator()() {
  for (auto &bb : func.getMutableBBs()) {
    for (auto &inst : bb.getMutableInsts()) {
      auto br = ir::dyc<ir::Branch>(inst);
      if (!br)
        continue;
      auto condition = ir::dyc<ir::IntLiteral>(br->getCondition());
      if (!condition)
        continue;
      ++cnt;
      auto target = condition->getVal() ? br->getThen() : br->getElse();
      inst = std::make_shared<ir::Jump>(target);
      auto notTarget = condition->getVal() ? br->getElse() : br->getThen();
      deletePhiOptionInBB(func.getMutableBasicBlock(notTarget->getID()),
                          bb.getLabelID());
    }
  }

  return cnt != 0;
}